

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitStringEq(PrintExpressionContents *this,StringEq *curr)

{
  StringEq *curr_local;
  PrintExpressionContents *this_local;
  
  if (curr->op == StringEqEqual) {
    printMedium(this->o,"string.eq");
  }
  else {
    if (curr->op != StringEqCompare) {
      handle_unreachable("invalid string.eq*",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                         ,0x9a9);
    }
    printMedium(this->o,"string.compare");
  }
  return;
}

Assistant:

void visitStringEq(StringEq* curr) {
    switch (curr->op) {
      case StringEqEqual:
        printMedium(o, "string.eq");
        break;
      case StringEqCompare:
        printMedium(o, "string.compare");
        break;
      default:
        WASM_UNREACHABLE("invalid string.eq*");
    }
  }